

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O2

void re2c::calc_fill(dfa_t *dfa,vector<bool,_std::allocator<bool>_> *trivial,
                    vector<unsigned_long,_std::allocator<unsigned_long>_> *fill,size_t i)

{
  pointer puVar1;
  size_t *psVar2;
  size_type i_00;
  const_reference cVar3;
  ulong uVar4;
  size_t c;
  ulong uVar5;
  
  puVar1 = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1[i] == 0xfffffffffffffffe) {
    puVar1[i] = 0;
    psVar2 = (dfa->states).
             super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
             super__Vector_impl_data._M_start[i]->arcs;
    for (uVar5 = 0; uVar5 < dfa->nchars; uVar5 = uVar5 + 1) {
      i_00 = psVar2[uVar5];
      if (i_00 != 0xffffffffffffffff) {
        calc_fill(dfa,trivial,fill,i_00);
        cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](trivial,i_00);
        puVar1 = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = 1;
        if (cVar3) {
          uVar4 = puVar1[i_00] + 1;
        }
        if (puVar1[i] < uVar4) {
          puVar1[i] = uVar4;
        }
      }
    }
  }
  return;
}

Assistant:

static void calc_fill(
	const dfa_t &dfa,
	const std::vector<bool> &trivial,
	std::vector<size_t> &fill,
	size_t i)
{
	if (fill[i] == UNDEFINED)
	{
		fill[i] = 0;
		const size_t *arcs = dfa.states[i]->arcs;
		for (size_t c = 0; c < dfa.nchars; ++c)
		{
			const size_t j = arcs[c];
			if (j != dfa_t::NIL)
			{
				calc_fill(dfa, trivial, fill, j);
				size_t max = 1;
				if (trivial[j])
				{
					max += fill[j];
				}
				if (max > fill[i])
				{
					fill[i] = max;
				}
			}
		}
	}
}